

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainManager.hpp
# Opt level: O3

void __thiscall sjtu::TrainManager::query_train(TrainManager *this,int argc,string *argv)

{
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this_00;
  int iVar1;
  undefined4 extraout_var;
  long *plVar2;
  invalid_command *this_01;
  long lVar3;
  bool bVar4;
  string *psVar5;
  long lVar6;
  int iVar7;
  pair<long,_bool> pVar8;
  string date;
  string trainID;
  undefined1 *local_e0;
  long local_d8;
  undefined1 local_d0;
  undefined7 uStack_cf;
  undefined1 *local_c0;
  long local_b8;
  undefined1 local_b0;
  undefined7 uStack_af;
  TrainManager *local_a0;
  long *local_98;
  long local_90;
  long local_88 [2];
  string local_78;
  long local_58;
  char local_50;
  ulong local_48;
  timeType local_40;
  
  local_c0 = &local_b0;
  iVar7 = 0;
  local_b8 = 0;
  local_b0 = 0;
  local_e0 = &local_d0;
  local_d8 = 0;
  local_d0 = 0;
  if (0 < argc) {
    local_a0 = this;
    do {
      iVar1 = std::__cxx11::string::compare((char *)argv);
      psVar5 = (string *)&local_c0;
      if ((iVar1 != 0) &&
         (iVar1 = std::__cxx11::string::compare((char *)argv), psVar5 = (string *)&local_e0,
         iVar1 != 0)) {
        this_01 = (invalid_command *)__cxa_allocate_exception(0x68);
        invalid_command::invalid_command(this_01);
        __cxa_throw(this_01,&invalid_command::typeinfo,invalid_command::~invalid_command);
      }
      std::__cxx11::string::_M_assign(psVar5);
      argv = argv + 2;
      iVar7 = iVar7 + 2;
      this = local_a0;
    } while (iVar7 < argc);
  }
  this_00 = this->TrainBpTree;
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char*>((string *)&local_98,local_c0,local_c0 + local_b8);
  if (local_90 == 0) {
    local_48 = 0;
  }
  else {
    lVar6 = 0;
    lVar3 = 0;
    local_48 = 0;
    do {
      lVar3 = ((long)*(char *)((long)local_98 + lVar6) + lVar3 * 0x239 + 0x100) % 0x3b800001;
      local_48 = (long)((long)*(char *)((long)local_98 + lVar6) + local_48 * 0x301 + 0x100) %
                 0x3b9aca07;
      lVar6 = lVar6 + 1;
    } while (local_90 != lVar6);
    local_48 = lVar3 << 0x20 | local_48;
  }
  pVar8 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                    (this_00,&local_48);
  local_58 = pVar8.first;
  bVar4 = pVar8.second;
  local_50 = bVar4;
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  if (bVar4 == false) {
    plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,-1);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
  }
  else {
    iVar7 = (*(this->TrainFile->super_FileManager_Base<sjtu::trainType>)._vptr_FileManager_Base[2])
                      (this->TrainFile,&local_58);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_78,local_e0,local_e0 + local_d8);
    timeType::timeType(&local_40,&local_78);
    trainType::display((trainType *)CONCAT44(extraout_var,iVar7),&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,CONCAT71(uStack_cf,local_d0) + 1);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,CONCAT71(uStack_af,local_b0) + 1);
  }
  return;
}

Assistant:

void query_train(int argc , std::string *argv)
		{
			std::string trainID , date;
			for (int i = 0;i < argc;i += 2)
				if (argv[i] == "-i") trainID = argv[i + 1];
				else if (argv[i] == "-d") date = argv[i + 1];
				else throw invalid_command();
			auto ret = TrainBpTree -> find(hasher(trainID));
			if (ret.second == false) std::cout << -1 << std::endl;
			else TrainFile -> read(ret.first) -> display(timeType(date));
		}